

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_type_handler.h
# Opt level: O1

uint8_t * google::protobuf::internal::
          MapEntryFuncs<unsigned_long,_unsigned_long,_(google::protobuf::internal::WireFormatLite::FieldType)4,_(google::protobuf::internal::WireFormatLite::FieldType)4>
          ::InternalSerialize(int field_number,unsigned_long *key,unsigned_long *value,uint8_t *ptr,
                             EpsCopyOutputStream *stream)

{
  bool bVar1;
  long lVar2;
  long lVar3;
  byte *pbVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (stream->end_ <= ptr) {
    ptr = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,ptr);
  }
  uVar7 = (ulong)(field_number * 8 + 2);
  if (0x7f < (uint)(field_number << 3)) {
    do {
      uVar5 = (uint)uVar7;
      *ptr = (byte)uVar7 | 0x80;
      uVar7 = uVar7 >> 7;
      ptr = ptr + 1;
    } while (0x3fff < uVar5);
  }
  *ptr = (byte)uVar7;
  lVar2 = 0x3f;
  if ((*key | 1) != 0) {
    for (; (*key | 1) >> lVar2 == 0; lVar2 = lVar2 + -1) {
    }
  }
  lVar3 = 0x3f;
  if ((*value | 1) != 0) {
    for (; (*value | 1) >> lVar3 == 0; lVar3 = lVar3 + -1) {
    }
  }
  ptr[1] = (char)((int)lVar3 * 9 + 0x49U >> 6) + (char)((int)lVar2 * 9 + 0x49U >> 6) + 2;
  pbVar4 = ptr + 2;
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  uVar7 = *key;
  *pbVar4 = 8;
  pbVar4 = pbVar4 + 1;
  uVar6 = uVar7;
  if (0x7f < uVar7) {
    do {
      *pbVar4 = (byte)uVar6 | 0x80;
      uVar7 = uVar6 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar7;
    } while (bVar1);
  }
  *pbVar4 = (byte)uVar7;
  pbVar4 = pbVar4 + 1;
  if (stream->end_ <= pbVar4) {
    pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
  }
  uVar7 = *value;
  *pbVar4 = 0x10;
  pbVar4 = pbVar4 + 1;
  uVar6 = uVar7;
  if (0x7f < uVar7) {
    do {
      *pbVar4 = (byte)uVar6 | 0x80;
      uVar7 = uVar6 >> 7;
      pbVar4 = pbVar4 + 1;
      bVar1 = 0x3fff < uVar6;
      uVar6 = uVar7;
    } while (bVar1);
  }
  *pbVar4 = (byte)uVar7;
  return pbVar4 + 1;
}

Assistant:

static uint8_t* InternalSerialize(int field_number, const Key& key,
                                    const Value& value, uint8_t* ptr,
                                    io::EpsCopyOutputStream* stream) {
    ptr = stream->EnsureSpace(ptr);
    ptr = WireFormatLite::WriteTagToArray(
        field_number, WireFormatLite::WIRETYPE_LENGTH_DELIMITED, ptr);
    ptr = io::CodedOutputStream::WriteVarint32ToArray(GetCachedSize(key, value),
                                                      ptr);

    ptr = KeyTypeHandler::Write(kKeyFieldNumber, key, ptr, stream);
    return ValueTypeHandler::Write(kValueFieldNumber, value, ptr, stream);
  }